

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall
AddrManImpl::Attempt_(AddrManImpl *this,CService *addr,bool fCountFailure,NodeSeconds time)

{
  long lVar1;
  byte bVar2;
  strong_ordering sVar3;
  bool bVar4;
  AddrInfo *pAVar5;
  rep in_RCX;
  byte in_DL;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_RDI;
  long in_FS_OFFSET;
  AddrInfo *info;
  AddrInfo *pinfo;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  nid_type *in_stack_ffffffffffffffc0;
  CService *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),(char *)in_RDI,
             in_stack_ffffffffffffffac,(AnnotatedMixin<std::mutex> *)0xee63ff);
  pAVar5 = Find((AddrManImpl *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                in_stack_ffffffffffffffc0);
  if ((pAVar5 != (AddrInfo *)0x0) && ((pAVar5->m_last_try).__d.__r = in_RCX, (bVar2 & 1) != 0)) {
    sVar3 = std::chrono::
            operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                      (in_RDI,(time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (__unspec *)0xee646c);
    bVar4 = std::operator<(sVar3._M_value);
    if (bVar4) {
      (pAVar5->m_last_count_attempt).__d.__r = in_RCX;
      pAVar5->nAttempts = pAVar5->nAttempts + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::Attempt_(const CService& addr, bool fCountFailure, NodeSeconds time)
{
    AssertLockHeld(cs);

    AddrInfo* pinfo = Find(addr);

    // if not found, bail out
    if (!pinfo)
        return;

    AddrInfo& info = *pinfo;

    // update info
    info.m_last_try = time;
    if (fCountFailure && info.m_last_count_attempt < m_last_good) {
        info.m_last_count_attempt = time;
        info.nAttempts++;
    }
}